

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O1

bool IsWitnessStandard(CTransaction *tx,CCoinsViewCache *mapInputs)

{
  pointer pvVar1;
  char *pcVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  Coin *pCVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  pointer pCVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  long in_FS_OFFSET;
  int witnessversion;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  CScript prevScript;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_98;
  direct_or_indirect local_78;
  uint local_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = CTransaction::IsCoinBase(tx);
  bVar7 = true;
  if ((!bVar6) &&
     (pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start,
     (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_finish != pCVar13)) {
    uVar12 = 0;
    do {
      if (pCVar13[uVar12].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pCVar13[uVar12].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar8 = CCoinsViewCache::AccessCoin(mapInputs,&pCVar13[uVar12].prevout);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                   &(pCVar8->out).scriptPubKey.super_CScriptBase);
        bVar6 = CScript::IsPayToAnchor((CScript *)&local_58.indirect_contents);
        iVar16 = 1;
        if (!bVar6) {
          bVar6 = CScript::IsPayToScriptHash((CScript *)&local_58.indirect_contents);
          if (bVar6) {
            local_98.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_78.indirect_contents.indirect = (char *)&PTR_CheckECDSASignature_006cba80;
            bVar6 = EvalScript(&local_98,
                               &(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar12].scriptSig,0,
                               (BaseSignatureChecker *)&local_78,BASE,(ScriptError *)0x0);
            if ((bVar6) &&
               (local_98.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_98.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              prevector<28U,_unsigned_char,_unsigned_int,_int>::
              prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              if (0x1c < local_3c) {
                free(local_58.indirect_contents.indirect);
              }
              local_58._20_8_ = CONCAT44(local_78._24_4_,local_78._20_4_);
              local_58._16_4_ = local_78._16_4_;
              local_58.indirect_contents.indirect = local_78.indirect_contents.indirect;
              local_58.indirect_contents.capacity = local_78.indirect_contents.capacity;
              local_58._12_4_ = local_78._12_4_;
              local_3c = local_5c;
              bVar6 = true;
            }
            else {
              bVar6 = false;
            }
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector(&local_98);
            if (!bVar6) goto LAB_00368841;
          }
          else {
            bVar6 = false;
          }
          local_98.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_98.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          local_78.indirect_contents.indirect = (char *)0x0;
          local_78.indirect_contents.capacity = 0;
          local_78._12_4_ = 0;
          local_78._16_4_ = 0;
          local_78._20_4_ = 0;
          bVar7 = CScript::IsWitnessProgram
                            ((CScript *)&local_58.indirect_contents,(int *)&local_98,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
          iVar16 = 1;
          if (!bVar7) goto LAB_0036882a;
          if ((int)local_98.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 1) {
            if (!bVar6 && CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity) -
                          local_78._0_8_ == 0x20) {
              pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start;
              plVar11 = *(long **)&pCVar13[uVar12].scriptWitness.stack;
              lVar9 = (long)*(pointer *)((long)&pCVar13[uVar12].scriptWitness.stack + 8) -
                      (long)plVar11;
              uVar10 = (lVar9 >> 3) * -0x5555555555555555;
              if (uVar10 < 2) {
LAB_00368813:
                iVar16 = 1;
                if (lVar9 == 0x18) {
LAB_0036881f:
                  iVar16 = 0;
                }
              }
              else {
                pcVar2 = *(char **)((long)plVar11 + lVar9 + -0x18);
                if ((pcVar2 == *(char **)((long)plVar11 + lVar9 + -0x10)) ||
                   (iVar16 = 1, *pcVar2 != 'P')) {
                  if (uVar10 < 2) goto LAB_00368813;
                  pbVar3 = *(byte **)((long)plVar11 + lVar9 + -0x18);
                  if (pbVar3 == *(byte **)((long)plVar11 + lVar9 + -0x10)) {
                    iVar16 = 1;
                  }
                  else {
                    if ((*pbVar3 & 0xfe) == 0xc0) {
                      iVar16 = 8;
                      bVar6 = plVar11 == (long *)((long)plVar11 + lVar9 + -0x30);
                      if (!bVar6) {
                        if ((ulong)(plVar11[1] - *plVar11) < 0x51) {
                          lVar14 = 0;
                          do {
                            bVar6 = lVar9 + -0x48 == lVar14;
                            if (bVar6) goto LAB_00368806;
                            lVar4 = lVar14 + 0x20;
                            lVar5 = lVar14 + 0x18;
                            lVar14 = lVar14 + 0x18;
                          } while ((ulong)(*(long *)((long)plVar11 + lVar4) -
                                          *(long *)((long)plVar11 + lVar5)) < 0x51);
                        }
                        iVar16 = 1;
                      }
LAB_00368806:
                      if (!bVar6) goto LAB_0036888f;
                    }
                    iVar16 = 0;
                  }
LAB_0036888f:
                  if (iVar16 != 0) goto LAB_00368822;
                  goto LAB_0036881f;
                }
              }
LAB_00368822:
              if (iVar16 != 0) goto LAB_0036882a;
            }
LAB_00368827:
            iVar16 = 0;
          }
          else {
            if (((int)local_98.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0) ||
               (CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity) - local_78._0_8_ !=
                0x20)) goto LAB_00368827;
            pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pvVar1 = *(pointer *)((long)&pCVar13[uVar12].scriptWitness.stack + 8);
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar1[-1].
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + 8) -
                       *(long *)&pvVar1[-1].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl) < 0xe11) {
              lVar9 = *(long *)&pCVar13[uVar12].scriptWitness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ;
              uVar10 = ((long)pvVar1 - lVar9 >> 3) * -0x5555555555555555 - 1;
              iVar16 = 0;
              if (uVar10 < 0x65) {
                if (uVar10 == 0) {
                  bVar6 = true;
                }
                else {
                  plVar11 = (long *)(lVar9 + 8);
                  uVar15 = 0;
                  do {
                    bVar6 = (ulong)(*plVar11 - plVar11[-1]) < 0x51;
                    if (!bVar6) goto LAB_003686f0;
                    uVar15 = uVar15 + 1;
                    plVar11 = plVar11 + 3;
                  } while (uVar15 < (uint)uVar10);
                  iVar16 = 0;
                }
              }
              else {
                bVar6 = false;
LAB_003686f0:
                iVar16 = 1;
              }
              if (bVar6) goto LAB_00368827;
            }
          }
LAB_0036882a:
          if ((_func_int **)local_78.indirect_contents.indirect != (_func_int **)0x0) {
            operator_delete(local_78.indirect_contents.indirect,
                            CONCAT44(local_78._20_4_,local_78._16_4_) - local_78._0_8_);
          }
        }
LAB_00368841:
        if (0x1c < local_3c) {
          free(local_58.indirect_contents.indirect);
          local_58.indirect_contents.indirect = (char *)0x0;
        }
        if (iVar16 != 0) goto LAB_0036889c;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar13 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
    iVar16 = 2;
LAB_0036889c:
    bVar7 = iVar16 == 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool IsWitnessStandard(const CTransaction& tx, const CCoinsViewCache& mapInputs)
{
    if (tx.IsCoinBase())
        return true; // Coinbases are skipped

    for (unsigned int i = 0; i < tx.vin.size(); i++)
    {
        // We don't care if witness for this input is empty, since it must not be bloated.
        // If the script is invalid without witness, it would be caught sooner or later during validation.
        if (tx.vin[i].scriptWitness.IsNull())
            continue;

        const CTxOut &prev = mapInputs.AccessCoin(tx.vin[i].prevout).out;

        // get the scriptPubKey corresponding to this input:
        CScript prevScript = prev.scriptPubKey;

        // witness stuffing detected
        if (prevScript.IsPayToAnchor()) {
            return false;
        }

        bool p2sh = false;
        if (prevScript.IsPayToScriptHash()) {
            std::vector <std::vector<unsigned char> > stack;
            // If the scriptPubKey is P2SH, we try to extract the redeemScript casually by converting the scriptSig
            // into a stack. We do not check IsPushOnly nor compare the hash as these will be done later anyway.
            // If the check fails at this stage, we know that this txid must be a bad one.
            if (!EvalScript(stack, tx.vin[i].scriptSig, SCRIPT_VERIFY_NONE, BaseSignatureChecker(), SigVersion::BASE))
                return false;
            if (stack.empty())
                return false;
            prevScript = CScript(stack.back().begin(), stack.back().end());
            p2sh = true;
        }

        int witnessversion = 0;
        std::vector<unsigned char> witnessprogram;

        // Non-witness program must not be associated with any witness
        if (!prevScript.IsWitnessProgram(witnessversion, witnessprogram))
            return false;

        // Check P2WSH standard limits
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            if (tx.vin[i].scriptWitness.stack.back().size() > MAX_STANDARD_P2WSH_SCRIPT_SIZE)
                return false;
            size_t sizeWitnessStack = tx.vin[i].scriptWitness.stack.size() - 1;
            if (sizeWitnessStack > MAX_STANDARD_P2WSH_STACK_ITEMS)
                return false;
            for (unsigned int j = 0; j < sizeWitnessStack; j++) {
                if (tx.vin[i].scriptWitness.stack[j].size() > MAX_STANDARD_P2WSH_STACK_ITEM_SIZE)
                    return false;
            }
        }

        // Check policy limits for Taproot spends:
        // - MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE limit for stack item size
        // - No annexes
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE && !p2sh) {
            // Taproot spend (non-P2SH-wrapped, version 1, witness program size 32; see BIP 341)
            Span stack{tx.vin[i].scriptWitness.stack};
            if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
                // Annexes are nonstandard as long as no semantics are defined for them.
                return false;
            }
            if (stack.size() >= 2) {
                // Script path spend (2 or more stack elements after removing optional annex)
                const auto& control_block = SpanPopBack(stack);
                SpanPopBack(stack); // Ignore script
                if (control_block.empty()) return false; // Empty control block is invalid
                if ((control_block[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                    // Leaf version 0xc0 (aka Tapscript, see BIP 342)
                    for (const auto& item : stack) {
                        if (item.size() > MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE) return false;
                    }
                }
            } else if (stack.size() == 1) {
                // Key path spend (1 stack element after removing optional annex)
                // (no policy rules apply)
            } else {
                // 0 stack elements; this is already invalid by consensus rules
                return false;
            }
        }
    }
    return true;
}